

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseQuadrupole
          (MultipoleAtomTypesSectionParser *this,StringTokenizer *tokenizer,
          Vector3d *quadrupoleMoments,int lineNo)

{
  int iVar1;
  double *pdVar2;
  uint in_ECX;
  Vector<double,_3U> *in_RDX;
  RealType RVar3;
  StringTokenizer *in_stack_00000010;
  int nTokens;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = StringTokenizer::countTokens
                    ((StringTokenizer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  if (iVar1 < 3) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX);
    painCave.isFatal = 1;
    simError();
  }
  else {
    RVar3 = StringTokenizer::nextTokenAsDouble(in_stack_00000010);
    pdVar2 = Vector<double,_3U>::operator[](in_RDX,0);
    *pdVar2 = RVar3;
    RVar3 = StringTokenizer::nextTokenAsDouble(in_stack_00000010);
    pdVar2 = Vector<double,_3U>::operator[](in_RDX,1);
    *pdVar2 = RVar3;
    RVar3 = StringTokenizer::nextTokenAsDouble(in_stack_00000010);
    pdVar2 = Vector<double,_3U>::operator[](in_RDX,2);
    *pdVar2 = RVar3;
  }
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseQuadrupole(
      StringTokenizer& tokenizer, Vector3d& quadrupoleMoments, int lineNo) {
    int nTokens = tokenizer.countTokens();
    if (nTokens >= 3) {
      quadrupoleMoments[0] = tokenizer.nextTokenAsDouble();
      quadrupoleMoments[1] = tokenizer.nextTokenAsDouble();
      quadrupoleMoments[2] = tokenizer.nextTokenAsDouble();

      // RealType trace =  quadrupoleMoments.sum();
      //
      // if (fabs(trace) > OpenMD::epsilon) {
      //   snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   "MultipoleAtomTypesSectionParser Error: the trace of quadrupole
      //   moments is not zero at line %d\n", 	lineNo); painCave.isFatal = 1;
      //   simError();
      // }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }